

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::num_parse<wchar_t>::num_parse
          (num_parse<wchar_t> *this,cdata *d,size_t refs)

{
  Locale *in_RSI;
  undefined8 *in_RDI;
  
  std::num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::num_get
            ((ulong)in_RDI);
  *in_RDI = &PTR__num_parse_002eb378;
  icu_70::Locale::Locale((Locale *)(in_RDI + 2),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 0x1e),(string *)(in_RSI + 0xe0));
  return;
}

Assistant:

num_parse(cdata const &d,size_t refs = 0) : 
        std::num_get<CharType>(refs),
        loc_(d.locale),
        enc_(d.encoding)
    {
    }